

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O2

bool_t prf_material_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint32_t *puVar1;
  uint uVar2;
  ushort uVar3;
  uint len;
  bool_t bVar4;
  
  if (node->opcode == prf_material_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar3 = node->length;
    if (uVar3 < 8) {
      uVar2 = 4;
    }
    else {
      puVar1 = (uint32_t *)node->data;
      bf_put_uint32_be(bfile,*puVar1);
      uVar3 = node->length;
      if (uVar3 < 0x14) {
        uVar2 = 8;
      }
      else {
        bf_write(bfile,(uint8_t *)(puVar1 + 1),0xc);
        uVar3 = node->length;
        if (uVar3 < 0x18) {
          uVar2 = 0x14;
        }
        else {
          bf_put_uint32_be(bfile,puVar1[4]);
          uVar3 = node->length;
          if (uVar3 < 0x1c) {
            uVar2 = 0x18;
          }
          else {
            bf_put_float32_be(bfile,(float32_t)puVar1[5]);
            uVar3 = node->length;
            if (uVar3 < 0x20) {
              uVar2 = 0x1c;
            }
            else {
              bf_put_float32_be(bfile,(float32_t)puVar1[6]);
              uVar3 = node->length;
              if (uVar3 < 0x24) {
                uVar2 = 0x20;
              }
              else {
                bf_put_float32_be(bfile,(float32_t)puVar1[7]);
                uVar3 = node->length;
                if (uVar3 < 0x28) {
                  uVar2 = 0x24;
                }
                else {
                  bf_put_float32_be(bfile,(float32_t)puVar1[8]);
                  uVar3 = node->length;
                  if (uVar3 < 0x2c) {
                    uVar2 = 0x28;
                  }
                  else {
                    bf_put_float32_be(bfile,(float32_t)puVar1[9]);
                    uVar3 = node->length;
                    if (uVar3 < 0x30) {
                      uVar2 = 0x2c;
                    }
                    else {
                      bf_put_float32_be(bfile,(float32_t)puVar1[10]);
                      uVar3 = node->length;
                      if (uVar3 < 0x34) {
                        uVar2 = 0x30;
                      }
                      else {
                        bf_put_float32_be(bfile,(float32_t)puVar1[0xb]);
                        uVar3 = node->length;
                        if (uVar3 < 0x38) {
                          uVar2 = 0x34;
                        }
                        else {
                          bf_put_float32_be(bfile,(float32_t)puVar1[0xc]);
                          uVar3 = node->length;
                          if (uVar3 < 0x3c) {
                            uVar2 = 0x38;
                          }
                          else {
                            bf_put_float32_be(bfile,(float32_t)puVar1[0xd]);
                            uVar3 = node->length;
                            if (uVar3 < 0x40) {
                              uVar2 = 0x3c;
                            }
                            else {
                              bf_put_float32_be(bfile,(float32_t)puVar1[0xe]);
                              uVar3 = node->length;
                              if (uVar3 < 0x44) {
                                uVar2 = 0x40;
                              }
                              else {
                                bf_put_float32_be(bfile,(float32_t)puVar1[0xf]);
                                uVar3 = node->length;
                                if (uVar3 < 0x48) {
                                  uVar2 = 0x44;
                                }
                                else {
                                  bf_put_float32_be(bfile,(float32_t)puVar1[0x10]);
                                  uVar3 = node->length;
                                  if (uVar3 < 0x4c) {
                                    uVar2 = 0x48;
                                  }
                                  else {
                                    bf_put_float32_be(bfile,(float32_t)puVar1[0x11]);
                                    uVar3 = node->length;
                                    if (uVar3 < 0x50) {
                                      uVar2 = 0x4c;
                                    }
                                    else {
                                      bf_put_float32_be(bfile,(float32_t)puVar1[0x12]);
                                      uVar3 = node->length;
                                      if (uVar3 < 0x54) {
                                        uVar2 = 0x50;
                                      }
                                      else {
                                        bf_put_uint32_be(bfile,puVar1[0x13]);
                                        uVar3 = node->length;
                                        uVar2 = 0x54;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar4 = 1;
    len = uVar3 - uVar2;
    if (uVar2 <= uVar3 && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar2 - 4),len);
    }
  }
  else {
    bVar4 = 0;
    prf_error(9,"tried using material save method for node of type %d.");
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_material_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_info.opcode ) {
        prf_error( 9, "tried using material save method for node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->material_index ); pos += 4;
        if ( node->length < (pos + 12) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->spare ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}